

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

int mapRiver(Layer *l,int *out,int x,int z,int w,int h)

{
  char cVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int *piVar12;
  long lVar13;
  
  iVar2 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar2 == 0) {
    if (0 < h) {
      cVar1 = l->mc;
      lVar3 = (long)w;
      piVar7 = out + lVar3 * 2 + 5;
      piVar8 = out + lVar3 + 4;
      lVar9 = 0;
      piVar12 = out;
      do {
        if (0 < w) {
          lVar13 = 0;
          do {
            uVar6 = piVar8[lVar13 + -2];
            uVar5 = piVar8[lVar13 + -1];
            uVar10 = piVar8[lVar13];
            uVar4 = piVar12[lVar13 + 1];
            uVar11 = piVar7[lVar13];
            if (cVar1 < '\n') {
              if (uVar5 != 0) goto LAB_00108882;
LAB_0010889b:
              out[lVar13] = 7;
            }
            else {
              if (1 < (int)uVar6) {
                uVar6 = uVar6 & 1 | 2;
              }
              if (1 < (int)uVar5) {
                uVar5 = uVar5 & 1 | 2;
              }
              if (1 < (int)uVar10) {
                uVar10 = uVar10 & 1 | 2;
              }
              if (1 < (int)uVar4) {
                uVar4 = uVar4 & 1 | 2;
              }
              if (1 < (int)uVar11) {
                uVar11 = uVar11 & 1 | 2;
              }
LAB_00108882:
              if ((((uVar5 != uVar6) || (uVar5 != uVar4)) || (uVar5 != uVar11)) || (uVar5 != uVar10)
                 ) goto LAB_0010889b;
              out[lVar13] = -1;
            }
            lVar13 = lVar13 + 1;
          } while (lVar3 != lVar13);
        }
        lVar9 = lVar9 + 1;
        out = out + lVar3;
        piVar7 = piVar7 + lVar3 + 2;
        piVar12 = piVar12 + lVar3 + 2;
        piVar8 = piVar8 + lVar3 + 2;
      } while (lVar9 != h);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapRiver(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    int mc = l->mc;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        for (i = 0; i < w; i++)
        {
            int v01 = vz1[i+0];
            int v11 = vz1[i+1];
            int v21 = vz1[i+2];
            int v10 = vz0[i+1];
            int v12 = vz2[i+1];

            if (mc >= MC_1_7)
            {
                v01 = reduceID(v01);
                v11 = reduceID(v11);
                v21 = reduceID(v21);
                v10 = reduceID(v10);
                v12 = reduceID(v12);
            }
            else if (v11 == 0)
            {
                out[i + j * w] = river;
                continue;
            }

            if (v11 == v01 && v11 == v10 && v11 == v12 && v11 == v21)
            {
                out[i + j * w] = -1;
            }
            else
            {
                out[i + j * w] = river;
            }
        }
    }

    return 0;
}